

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

int __thiscall xmrig::OclBackendPrivate::init(OclBackendPrivate *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  uint uVar2;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar3;
  String *this_00;
  EVP_PKEY_CTX *ctx_00;
  undefined7 extraout_var;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  int __c;
  int __c_00;
  OclDevice *device;
  iterator __end2;
  iterator __begin2;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *__range2;
  uint32_t in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  OclDevice *in_stack_fffffffffffffee0;
  OclPlatform *in_stack_fffffffffffffee8;
  OclDevice *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff08;
  uint32_t in_stack_ffffffffffffff0c;
  OclDevice *this_01;
  String local_a8;
  String local_98;
  OclDevice *local_88;
  OclConfig *in_stack_ffffffffffffff80;
  __normal_iterator<xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
  in_stack_ffffffffffffff88;
  String local_58;
  cl_platform_id local_20;
  char *local_18;
  OclConfig *local_10;
  OclBackendPrivate *local_8;
  undefined7 extraout_var_00;
  
  local_10 = (OclConfig *)ctx;
  local_8 = this;
  bVar1 = OclConfig::isEnabled((OclConfig *)ctx);
  if (bVar1) {
    this_00 = OclConfig::loader(local_10);
    ctx_00 = (EVP_PKEY_CTX *)String::operator_cast_to_char_(this_00);
    uVar2 = OclLib::init(ctx_00);
    if ((uVar2 & 1) == 0) {
      printDisabled((char *)0x20b963);
      iVar3 = extraout_EAX_00;
    }
    else {
      bVar1 = OclPlatform::isValid(&this->platform);
      iVar3 = (int)CONCAT71(extraout_var,bVar1);
      if (!bVar1) {
        _local_20 = OclConfig::platform(in_stack_ffffffffffffff80);
        (this->platform).m_id = local_20;
        (this->platform).m_index = (size_t)local_18;
        bVar1 = OclPlatform::isValid(&this->platform);
        if (bVar1) {
          OclPlatform::devices((OclPlatform *)in_stack_ffffffffffffff88._M_current);
          pcVar4 = &stack0xffffffffffffffc8;
          std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::operator=
                    ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                     in_stack_fffffffffffffef0,
                     (vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                     in_stack_fffffffffffffee8);
          std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector
                    ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                     in_stack_fffffffffffffef0);
          bVar1 = std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::empty
                            ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                             in_stack_fffffffffffffef0);
          if (bVar1) {
            printDisabled((char *)0x20ba32);
            iVar3 = extraout_EAX_02;
          }
          else {
            pcVar4 = OclPlatform::index(&this->platform,pcVar4,__c);
            this_01 = (OclDevice *)&stack0xffffffffffffffb8;
            OclPlatform::name(in_stack_fffffffffffffee8);
            pcVar5 = String::data((String *)this_01);
            OclPlatform::version(in_stack_fffffffffffffee8);
            pcVar6 = String::data(&local_58);
            Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu \x1b[0m\x1b[1;37m%s\x1b[0m/\x1b[1;37m%s\x1b[0m"
                       ,"OPENCL",pcVar4,pcVar5,pcVar6);
            String::~String((String *)in_stack_fffffffffffffee0);
            String::~String((String *)in_stack_fffffffffffffee0);
            std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::begin
                      ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
            std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::end
                      ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
            while( true ) {
              pcVar4 = &stack0xffffffffffffff80;
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
                                  *)in_stack_fffffffffffffee0,
                                 (__normal_iterator<xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
              iVar3 = (int)CONCAT71(extraout_var_00,bVar1);
              if (!bVar1) break;
              local_88 = __gnu_cxx::
                         __normal_iterator<xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
                         ::operator*((__normal_iterator<xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
                                      *)&stack0xffffffffffffff88);
              pcVar4 = OclDevice::index(local_88,pcVar4,__c_00);
              OclDevice::topology(local_88);
              PciTopology::toString
                        ((PciTopology *)
                         CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
              pcVar5 = String::data(&local_98);
              OclDevice::printableName(this_01);
              pcVar6 = String::data(&local_a8);
              uVar7 = OclDevice::clock(local_88);
              in_stack_fffffffffffffed8 = OclDevice::computeUnits(local_88);
              sVar8 = OclDevice::freeMemSize(in_stack_fffffffffffffef0);
              in_stack_fffffffffffffee0 = (OclDevice *)(sVar8 >> 0x14);
              sVar8 = OclDevice::globalMemSize(local_88);
              in_stack_fffffffffffffef0 = in_stack_fffffffffffffee0;
              in_stack_ffffffffffffff0c = in_stack_fffffffffffffed8;
              Log::print("\x1b[1;32m * \x1b[0m\x1b[1;37m%-13s\x1b[0m\x1b[1;36m#%zu\x1b[0m\x1b[0;33m %s\x1b[0m %s \x1b[1;37m%u MHz\x1b[0m cu:\x1b[1;37m%u\x1b[0m mem:\x1b[0;36m%zu/%zu\x1b[0m MB"
                         ,"OPENCL GPU",(ulong)pcVar4 & 0xffffffff,pcVar5,pcVar6,uVar7 & 0xffffffff,
                         in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,sVar8 >> 0x14);
              String::~String((String *)in_stack_fffffffffffffee0);
              String::~String((String *)in_stack_fffffffffffffee0);
              __gnu_cxx::
              __normal_iterator<xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
              ::operator++((__normal_iterator<xmrig::OclDevice_*,_std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>_>
                            *)&stack0xffffffffffffff88);
            }
          }
        }
        else {
          printDisabled((char *)0x20b9d4);
          iVar3 = extraout_EAX_01;
        }
      }
    }
  }
  else {
    printDisabled((char *)0x20b931);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

void init(const OclConfig &cl)
    {
        if (!cl.isEnabled()) {
            return printDisabled("");
        }

        if (!OclLib::init(cl.loader())) {
            return printDisabled(RED_S " (failed to load OpenCL runtime)");
        }

        if (platform.isValid()) {
            return;
        }

        platform = cl.platform();
        if (!platform.isValid()) {
            return printDisabled(RED_S " (selected OpenCL platform NOT found)");
        }

        devices = platform.devices();
        if (devices.empty()) {
            return printDisabled(RED_S " (no devices)");
        }

        Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu ") WHITE_BOLD("%s") "/" WHITE_BOLD("%s"), "OPENCL", platform.index(), platform.name().data(), platform.version().data());

        for (const OclDevice &device : devices) {
            Log::print(GREEN_BOLD(" * ") WHITE_BOLD("%-13s") CYAN_BOLD("#%zu") YELLOW(" %s") " %s " WHITE_BOLD("%u MHz") " cu:" WHITE_BOLD("%u") " mem:" CYAN("%zu/%zu") " MB",
                       "OPENCL GPU",
                       device.index(),
                       device.topology().toString().data(),
                       device.printableName().data(),
                       device.clock(),
                       device.computeUnits(),
                       device.freeMemSize() / oneMiB,
                       device.globalMemSize() / oneMiB);
        }
    }